

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.cpp
# Opt level: O0

void __thiscall PingClient::PingClient(PingClient *this,string *remoteTarget,string *msg)

{
  long *plVar1;
  long lVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long *local_88;
  IPV4Address local_68 [11];
  undefined1 local_5d [8];
  char c;
  allocator<char> local_49;
  string local_48 [32];
  long *local_28;
  PacketStream *packetStream;
  string *msg_local;
  string *remoteTarget_local;
  PingClient *this_local;
  
  packetStream = (PacketStream *)msg;
  msg_local = remoteTarget;
  remoteTarget_local = (string *)this;
  Dashel::Hub::Hub(&this->super_Hub,true);
  *(undefined ***)this = &PTR__PingClient_00108cb8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"udp:port=8766",&local_49);
  lVar2 = Dashel::Hub::connect((string *)this);
  if (lVar2 == 0) {
    local_88 = (long *)0x0;
  }
  else {
    local_88 = (long *)__dynamic_cast(lVar2,&Dashel::Stream::typeinfo,
                                      &Dashel::PacketStream::typeinfo,0xffffffffffffffff);
  }
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  local_28 = local_88;
  if (local_88 != (long *)0x0) {
    lVar2 = *(long *)(*local_88 + -0x18);
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::length();
    (**(code **)(*(long *)((long)local_88 + lVar2) + 0x10))((long)local_88 + lVar2,uVar3,uVar4);
    local_5d[0] = 0;
    (**(code **)(*(long *)((long)local_28 + *(long *)(*local_28 + -0x18)) + 0x10))
              ((long)local_28 + *(long *)(*local_28 + -0x18),local_5d,1);
    plVar1 = local_28;
    Dashel::IPV4Address::IPV4Address(local_68,(string *)msg_local,0x223d);
    (**(code **)*plVar1)(plVar1,local_68);
    return;
  }
  __assert_fail("packetStream",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/aseba-community[P]dashel/examples/udp.cpp"
                ,0x3a,"PingClient::PingClient(const string &, const string &)");
}

Assistant:

PingClient(const string& remoteTarget, const string& msg)
	{
		PacketStream* packetStream = dynamic_cast<PacketStream*>(connect("udp:port=8766"));
		assert(packetStream);

		packetStream->write(msg.c_str(), msg.length());
		char c = 0;
		packetStream->write(&c, 1);

		packetStream->send(IPV4Address(remoteTarget, 8765));
	}